

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

StackVersion
ts_parser__reduce(TSParser *self,StackVersion version,TSSymbol symbol,uint32_t count,
                 int dynamic_precedence,uint16_t alias_sequence_id,_Bool fragile)

{
  SubtreePool *pool;
  int32_t *piVar1;
  uint uVar2;
  Subtree *pSVar3;
  uint32_t uVar4;
  _Bool _Var5;
  TSStateId state;
  TSStateId state_00;
  StackSlice *pSVar6;
  MutableSubtree subtree;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint version_00;
  StackVersion j;
  uint32_t uVar10;
  StackVersion SVar11;
  MutableSubtree MVar12;
  SubtreeHeapData *pSVar13;
  undefined2 in_register_0000008a;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  StackSlice *pSVar17;
  ulong uVar18;
  bool bVar19;
  byte bVar20;
  StackSliceArray SVar21;
  int local_cc;
  StackSlice slice;
  StackSlice next_slice;
  SubtreeArray local_58;
  StackSlice *local_48;
  ulong local_40;
  ulong local_38;
  
  bVar20 = 0;
  uVar2 = (self->stack->heads).size;
  SVar21 = ts_stack_pop_count(self->stack,version,count);
  pSVar6 = SVar21.contents;
  pool = &self->tree_pool;
  uVar9 = SVar21.size;
  uVar18 = (ulong)uVar9;
  local_48 = pSVar6 + 1;
  uVar16 = 0;
  local_cc = 0;
  local_40 = uVar18;
  do {
    if (uVar9 <= (uint)uVar16) {
      uVar9 = 0xffffffff;
      if (uVar2 < (self->stack->heads).size) {
        uVar9 = uVar2;
      }
      return uVar9;
    }
    slice.version = pSVar6[uVar16].version;
    slice._20_4_ = *(undefined4 *)&pSVar6[uVar16].field_0x14;
    pSVar17 = pSVar6 + uVar16;
    pSVar3 = (pSVar17->subtrees).contents;
    slice.subtrees.size = (pSVar17->subtrees).size;
    slice.subtrees.capacity = (pSVar17->subtrees).capacity;
    version_00 = slice.version - local_cc;
    slice.subtrees.contents = pSVar3;
    if (((uint)uVar16 == 0) || (version_00 < 0xb)) {
      uVar18 = slice.subtrees._8_8_ & 0xffffffff;
      uVar10 = slice.subtrees.size + 1;
      local_58.contents = pSVar3;
      local_58._8_8_ = slice.subtrees._8_8_;
      do {
        bVar19 = uVar18 == 0;
        uVar18 = uVar18 - 1;
        if (bVar19) {
          uVar10 = 0;
          break;
        }
        _Var5 = ts_subtree_extra(pSVar3[uVar18]);
        uVar10 = uVar10 - 1;
      } while (_Var5);
      local_58.size = uVar10;
      subtree = ts_subtree_new_node(pool,symbol,&local_58,
                                    CONCAT22(in_register_0000008a,alias_sequence_id),self->language)
      ;
      while (uVar15 = (int)uVar16 + 1, uVar15 < uVar9) {
        next_slice.version = pSVar6[uVar15].version;
        next_slice._20_4_ = *(undefined4 *)&pSVar6[uVar15].field_0x14;
        pSVar17 = pSVar6 + uVar15;
        pSVar3 = (pSVar17->subtrees).contents;
        next_slice.subtrees.size = (pSVar17->subtrees).size;
        next_slice.subtrees.capacity = (pSVar17->subtrees).capacity;
        next_slice.subtrees.contents = pSVar3;
        if (next_slice.version != slice.version) break;
        uVar18 = next_slice.subtrees._8_8_ & 0xffffffff;
        uVar10 = next_slice.subtrees.size + 1;
        do {
          bVar19 = uVar18 == 0;
          uVar18 = uVar18 - 1;
          if (bVar19) {
            uVar10 = 0;
            break;
          }
          _Var5 = ts_subtree_extra(pSVar3[uVar18]);
          uVar10 = uVar10 - 1;
        } while (_Var5);
        lVar8 = 0xb;
        MVar12 = subtree;
        pSVar13 = (self->scratch_tree).ptr;
        for (lVar7 = lVar8; lVar7 != 0; lVar7 = lVar7 + -1) {
          uVar4 = ((Length *)((long)MVar12 + 4))->bytes;
          pSVar13->ref_count = *(uint32_t *)MVar12;
          (pSVar13->padding).bytes = uVar4;
          MVar12.data = MVar12.data + (ulong)bVar20 * -0x10 + 8;
          pSVar13 = (SubtreeHeapData *)((long)pSVar13 + (ulong)bVar20 * -0x10 + 8);
        }
        ((self->scratch_tree).ptr)->child_count = 0;
        ts_subtree_set_children(self->scratch_tree,pSVar3,uVar10,self->language);
        _Var5 = ts_parser__select_tree(self,(Subtree)subtree,*(Subtree *)&self->scratch_tree);
        if (_Var5) {
          pSVar13 = (self->scratch_tree).ptr;
          MVar12 = subtree;
          for (; lVar8 != 0; lVar8 = lVar8 + -1) {
            uVar10 = (pSVar13->padding).bytes;
            *(uint32_t *)MVar12 = pSVar13->ref_count;
            ((Length *)((long)MVar12 + 4))->bytes = uVar10;
            pSVar13 = (SubtreeHeapData *)((long)pSVar13 + (ulong)bVar20 * -0x10 + 8);
            MVar12.data = MVar12.data + (ulong)bVar20 * -0x10 + 8;
          }
          ts_subtree_array_delete(pool,&slice.subtrees);
          slice.version = next_slice.version;
          slice._20_4_ = next_slice._20_4_;
          slice.subtrees.contents = next_slice.subtrees.contents;
          slice.subtrees.size = next_slice.subtrees.size;
          slice.subtrees.capacity = next_slice.subtrees.capacity;
          uVar16 = (ulong)uVar15;
        }
        else {
          ts_subtree_array_delete(pool,&next_slice.subtrees);
          uVar16 = (ulong)uVar15;
        }
      }
      piVar1 = &((subtree.ptr)->field_17).field_0.dynamic_precedence;
      *piVar1 = *piVar1 + dynamic_precedence;
      ((subtree.ptr)->field_17).field_0.alias_sequence_id = alias_sequence_id;
      local_38 = uVar16;
      state = ts_stack_state(self->stack,version_00);
      state_00 = ts_language_next_state(self->language,state,symbol);
      if (1 < uVar2 || (1 < uVar9 || fragile)) {
        (subtree.ptr)->field_0x2c = (subtree.ptr)->field_0x2c | 0x18;
        state = TS_TREE_STATE_NONE;
      }
      (subtree.ptr)->parse_state = state;
      ts_stack_push(self->stack,version_00,(Subtree)subtree,false,state_00);
      pSVar3 = slice.subtrees.contents;
      uVar18 = slice.subtrees._8_8_ & 0xffffffff;
      for (uVar16 = (ulong)(subtree.ptr)->child_count; uVar16 < uVar18; uVar16 = uVar16 + 1) {
        ts_stack_push(self->stack,version_00,pSVar3[uVar16],false,state_00);
      }
      iVar14 = (int)local_38;
      for (SVar11 = 0; uVar18 = local_40, version_00 != SVar11; SVar11 = SVar11 + 1) {
        if ((version != SVar11) && (_Var5 = ts_stack_merge(self->stack,SVar11,version_00), _Var5)) {
          local_cc = local_cc + 1;
          uVar18 = local_40;
          break;
        }
      }
    }
    else {
      ts_stack_remove_version(self->stack,version_00);
      ts_subtree_array_delete(pool,&slice.subtrees);
      local_cc = local_cc + 1;
      SVar11 = slice.version;
      pSVar17 = local_48 + uVar16;
      while (uVar16 + 1 < uVar18) {
        next_slice.version = pSVar17->version;
        next_slice._20_4_ = *(undefined4 *)&pSVar17->field_0x14;
        next_slice.subtrees.contents = (pSVar17->subtrees).contents;
        next_slice.subtrees.size = (pSVar17->subtrees).size;
        next_slice.subtrees.capacity = (pSVar17->subtrees).capacity;
        if (next_slice.version != SVar11) break;
        ts_subtree_array_delete(pool,&next_slice.subtrees);
        pSVar17 = pSVar17 + 1;
        uVar16 = uVar16 + 1;
      }
      iVar14 = (int)uVar16;
    }
    uVar16 = (ulong)(iVar14 + 1);
  } while( true );
}

Assistant:

static StackVersion ts_parser__reduce(TSParser *self, StackVersion version, TSSymbol symbol,
                                      uint32_t count, int dynamic_precedence,
                                      uint16_t alias_sequence_id, bool fragile) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);
  uint32_t removed_version_count = 0;
  StackSliceArray pop = ts_stack_pop_count(self->stack, version, count);

  for (uint32_t i = 0; i < pop.size; i++) {
    StackSlice slice = pop.contents[i];
    StackVersion slice_version = slice.version - removed_version_count;

    // Error recovery can sometimes cause lots of stack versions to merge,
    // such that a single pop operation can produce a lots of slices.
    // Avoid creating too many stack versions in that situation.
    if (i > 0 && slice_version > MAX_VERSION_COUNT + MAX_VERSION_COUNT_OVERFLOW) {
      ts_stack_remove_version(self->stack, slice_version);
      ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
      removed_version_count++;
      while (i + 1 < pop.size) {
        StackSlice next_slice = pop.contents[i + 1];
        if (next_slice.version != slice.version) break;
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
        i++;
      }
      continue;
    }

    // Extra tokens on top of the stack should not be included in this new parent
    // node. They will be re-pushed onto the stack after the parent node is
    // created and pushed.
    SubtreeArray children = slice.subtrees;
    while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
      children.size--;
    }

    MutableSubtree parent = ts_subtree_new_node(&self->tree_pool,
      symbol, &children, alias_sequence_id, self->language
    );

    // This pop operation may have caused multiple stack versions to collapse
    // into one, because they all diverged from a common state. In that case,
    // choose one of the arrays of trees to be the parent node's children, and
    // delete the rest of the tree arrays.
    while (i + 1 < pop.size) {
      StackSlice next_slice = pop.contents[i + 1];
      if (next_slice.version != slice.version) break;
      i++;

      SubtreeArray children = next_slice.subtrees;
      while (children.size > 0 && ts_subtree_extra(children.contents[children.size - 1])) {
        children.size--;
      }

      if (ts_parser__replace_children(self, &parent, &children)) {
        ts_subtree_array_delete(&self->tree_pool, &slice.subtrees);
        slice = next_slice;
      } else {
        ts_subtree_array_delete(&self->tree_pool, &next_slice.subtrees);
      }
    }

    parent.ptr->dynamic_precedence += dynamic_precedence;
    parent.ptr->alias_sequence_id = alias_sequence_id;

    TSStateId state = ts_stack_state(self->stack, slice_version);
    TSStateId next_state = ts_language_next_state(self->language, state, symbol);
    if (fragile || pop.size > 1 || initial_version_count > 1) {
      parent.ptr->fragile_left = true;
      parent.ptr->fragile_right = true;
      parent.ptr->parse_state = TS_TREE_STATE_NONE;
    } else {
      parent.ptr->parse_state = state;
    }

    // Push the parent node onto the stack, along with any extra tokens that
    // were previously on top of the stack.
    ts_stack_push(self->stack, slice_version, ts_subtree_from_mut(parent), false, next_state);
    for (uint32_t j = parent.ptr->child_count; j < slice.subtrees.size; j++) {
      ts_stack_push(self->stack, slice_version, slice.subtrees.contents[j], false, next_state);
    }

    for (StackVersion j = 0; j < slice_version; j++) {
      if (j == version) continue;
      if (ts_stack_merge(self->stack, j, slice_version)) {
        removed_version_count++;
        break;
      }
    }
  }

  // Return the first new stack version that was created.
  return ts_stack_version_count(self->stack) > initial_version_count
    ? initial_version_count
    : STACK_VERSION_NONE;
}